

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O2

void __thiscall
cppcms::anon_unknown_0::
base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
::~base_handler(base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
                *this)

{
  (this->super_option)._vptr_option = (_func_int **)&PTR__base_handler_002b4038;
  std::_Function_base::~_Function_base(&(this->handle_).super__Function_base);
  option::~option(&this->super_option);
  return;
}

Assistant:

base_handler(std::string expr,H handle,int a=0,int b=0,int c=0,int d=0,int e=0,int f=0)
				: option(expr),handle_(handle)
			{
				select_[0]=a;
				select_[1]=b;
				select_[2]=c;
				select_[3]=d;
				select_[4]=e;
				select_[5]=f;
			}